

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int re2::CEscapeString(char *src,int src_len,char *dest,int dest_len)

{
  byte bVar1;
  int iVar2;
  int local_3c;
  uchar c;
  int used;
  char *src_end;
  int dest_len_local;
  char *dest_local;
  byte *pbStack_18;
  int src_len_local;
  char *src_local;
  
  local_3c = 0;
  pbStack_18 = (byte *)src;
  while( true ) {
    if (src + src_len <= pbStack_18) {
      if (dest_len - local_3c < 1) {
        src_local._4_4_ = -1;
      }
      else {
        dest[local_3c] = '\0';
        src_local._4_4_ = local_3c;
      }
      return src_local._4_4_;
    }
    if (dest_len - local_3c < 2) break;
    bVar1 = *pbStack_18;
    if (bVar1 == 9) {
      iVar2 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar2] = 't';
    }
    else if (bVar1 == 10) {
      iVar2 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar2] = 'n';
    }
    else if (bVar1 == 0xd) {
      iVar2 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar2] = 'r';
    }
    else if (bVar1 == 0x22) {
      iVar2 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar2] = '\"';
    }
    else if (bVar1 == 0x27) {
      iVar2 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar2] = '\'';
    }
    else if (bVar1 == 0x5c) {
      iVar2 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar2] = '\\';
    }
    else if ((bVar1 < 0x20) || (0x7e < bVar1)) {
      if (dest_len - local_3c < 5) {
        return -1;
      }
      snprintf(dest + local_3c,5,"\\%03o",(ulong)bVar1);
      local_3c = local_3c + 4;
    }
    else {
      dest[local_3c] = bVar1;
      local_3c = local_3c + 1;
    }
    pbStack_18 = pbStack_18 + 1;
  }
  return -1;
}

Assistant:

int CEscapeString(const char* src, int src_len, char* dest,
                  int dest_len) {
  const char* src_end = src + src_len;
  int used = 0;

  for (; src < src_end; src++) {
    if (dest_len - used < 2)   // space for two-character escape
      return -1;

    unsigned char c = *src;
    switch (c) {
      case '\n': dest[used++] = '\\'; dest[used++] = 'n';  break;
      case '\r': dest[used++] = '\\'; dest[used++] = 'r';  break;
      case '\t': dest[used++] = '\\'; dest[used++] = 't';  break;
      case '\"': dest[used++] = '\\'; dest[used++] = '\"'; break;
      case '\'': dest[used++] = '\\'; dest[used++] = '\''; break;
      case '\\': dest[used++] = '\\'; dest[used++] = '\\'; break;
      default:
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        if (c < ' ' || c > '~') {
          if (dest_len - used < 5)   // space for four-character escape + \0
            return -1;
#if !defined(_WIN32)
          snprintf(dest + used, 5, "\\%03o", c);
#else
          // On Windows, the function takes 4+VA arguments, not 3+VA. With an
          // array, the buffer size will be inferred, but not with a pointer.
          snprintf(dest + used, 5, _TRUNCATE, "\\%03o", c);
#endif
          used += 4;
        } else {
          dest[used++] = c; break;
        }
    }
  }

  if (dest_len - used < 1)   // make sure that there is room for \0
    return -1;

  dest[used] = '\0';   // doesn't count towards return value though
  return used;
}